

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGarbageQuadMesh
          (int hash,size_t numQuads,bool mblur,Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  reference pvVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  Vec3fa *pVVar8;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  Node *in_RDI;
  long *in_R8;
  float w_1;
  float z_1;
  float y_1;
  float x_1;
  size_t i_10;
  float w;
  float z;
  float y;
  float x;
  size_t i_5;
  uint v3;
  uint v2;
  uint v1;
  uint v0;
  size_t i;
  Ref<embree::SceneGraph::QuadMeshNode> mesh;
  RandomSampler sampler;
  uint hash_1;
  anon_union_4_2_947300a4 v_7;
  anon_union_4_2_947300a4 v_6;
  anon_union_4_2_947300a4 v_5;
  anon_union_4_2_947300a4 v_4;
  anon_union_4_2_947300a4 v_3;
  anon_union_4_2_947300a4 v_2;
  anon_union_4_2_947300a4 v_1;
  anon_union_4_2_947300a4 v;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_2;
  uint m_2;
  uint n_4;
  uint m_4;
  uint n_6;
  uint m_6;
  uint n_8;
  uint m_8;
  uint n_9;
  uint m_9;
  uint n_10;
  uint m_10;
  uint n_11;
  uint m_11;
  uint n_12;
  uint m_12;
  uint n_13;
  uint m_13;
  uint n_14;
  uint m_14;
  uint n_15;
  uint m_15;
  uint n_16;
  uint m_16;
  uint n_1;
  uint m_1;
  uint n_3;
  uint m_3;
  uint n_5;
  uint m_5;
  uint n_7;
  uint m_7;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_9;
  size_t i_8;
  Vec3fa *old_items_1;
  size_t i_7;
  size_t i_6;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffff898;
  size_t in_stack_fffffffffffff8a0;
  size_t in_stack_fffffffffffff8a8;
  size_type in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c4;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  BBox1f in_stack_fffffffffffff940;
  uint local_678;
  uint local_66c;
  uint local_660;
  uint local_654;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  uint local_5e0;
  uint local_5dc;
  uint local_5d8;
  uint local_5d4;
  ulong local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  uint local_5a0;
  uint local_59c;
  uint local_598;
  uint local_594;
  ulong local_590;
  Quad local_588;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  ulong local_568;
  undefined1 local_55d;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 uStack_550;
  long *local_540;
  _func_int **local_538;
  uint local_52c [4];
  byte local_519;
  ulong local_518;
  long **local_4f8;
  undefined4 *local_4f0;
  undefined4 *local_4e8;
  undefined4 *local_4e0;
  long **local_4d8;
  ulong local_4c8;
  reference local_4c0;
  ulong local_4b8;
  reference local_4b0;
  ulong local_4a8;
  reference local_4a0;
  ulong local_498;
  reference local_490;
  _func_int **local_488;
  _func_int ***local_480;
  _func_int ***local_478;
  _func_int ***local_470;
  _func_int ***local_468;
  _func_int ***local_460;
  _func_int ***local_458;
  _func_int ***local_450;
  _func_int ***local_448;
  _func_int ***local_438;
  undefined8 *local_428;
  Vec3fa *local_420;
  undefined8 *local_418;
  Vec3fa *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  uint local_3e8;
  uint *local_3e0;
  uint *local_3d8;
  uint *local_3d0;
  uint *local_3c8;
  uint *local_3c0;
  uint *local_3b8;
  uint *local_3b0;
  uint *local_3a8;
  uint *local_3a0;
  uint *local_398;
  uint *local_390;
  uint *local_388;
  uint *local_380;
  uint *local_378;
  uint *local_370;
  uint *local_368;
  uint *local_360;
  uint local_358;
  uint local_354;
  uint local_350;
  uint local_34c;
  uint local_348;
  uint local_344;
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  uint local_320;
  uint local_31c;
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_30c;
  undefined8 *local_308;
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  uint local_298;
  uint local_294;
  uint local_290;
  uint local_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  uint local_24c;
  uint local_248;
  uint local_244;
  undefined4 local_240;
  undefined4 local_23c;
  uint local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  undefined4 local_228;
  undefined4 local_224;
  uint local_220;
  undefined4 local_21c;
  undefined4 local_218;
  uint local_214;
  undefined4 local_210;
  undefined4 local_20c;
  uint local_208;
  undefined4 local_204;
  undefined4 local_200;
  int local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  int local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  int local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  uint local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  int local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  uint local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  uint local_19c;
  undefined4 local_198;
  undefined4 local_194;
  uint local_190;
  undefined4 local_18c;
  undefined4 local_188;
  uint local_184;
  ulong local_180;
  ulong local_178;
  Vec3fa *local_170;
  ulong local_168;
  ulong local_160;
  size_t local_158;
  ulong local_150;
  reference local_148;
  Vec3fa *local_140;
  Vec3fa *local_138;
  Vec3fa *local_130;
  Vec3fa *local_128;
  size_t local_120;
  Vec3fa *local_118;
  reference local_110;
  size_t local_108;
  reference local_100;
  ulong local_f8;
  ulong local_f0;
  Vec3fa *local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  ulong local_c8;
  reference local_c0;
  Vec3fa *local_b8;
  Vec3fa *local_b0;
  Vec3fa *local_a8;
  Vec3fa *local_a0;
  size_t local_98;
  Vec3fa *local_90;
  reference local_88;
  size_t local_80;
  reference local_78;
  unsigned_long local_70 [2];
  ulong local_60;
  ulong local_58;
  reference local_50;
  size_t local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_519 = in_CL & 1;
  local_3e0 = local_52c;
  local_250 = 0xcc9e2d51;
  local_254 = 0x1b873593;
  local_258 = 0xf;
  local_25c = 0xd;
  local_260 = 5;
  local_264 = 0xe6546b64;
  uVar3 = in_ESI * 0x16a88000 | (uint)(in_ESI * -0x3361d2af) >> 0x11;
  local_24c = uVar3 * 0x1b873593;
  local_248 = (uVar3 * -0x194da000 | local_24c >> 0x13) * 5 + 0xe6546b64;
  uVar3 = (local_248 >> 0x10 ^ local_248) * -0x7a143595;
  local_3e8 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
  local_3e8 = local_3e8 >> 0x10 ^ local_3e8;
  local_518 = in_RDX;
  local_244 = local_3e8;
  local_52c[0] = local_3e8;
  pp_Var4 = (_func_int **)::operator_new(0xd8);
  local_55d = 1;
  local_4f8 = &local_540;
  local_540 = (long *)*in_R8;
  if (local_540 != (long *)0x0) {
    (**(code **)(*local_540 + 0x10))();
  }
  local_558 = 0;
  local_55c = 0x3f800000;
  local_4e0 = &local_554;
  local_4e8 = &local_558;
  local_4f0 = &local_55c;
  local_554 = 0;
  uStack_550 = 0x3f800000;
  QuadMeshNode::QuadMeshNode
            ((QuadMeshNode *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             (Ref<embree::SceneGraph::MaterialNode> *)
             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),in_stack_fffffffffffff940
             ,CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_55d = 0;
  local_480 = &local_538;
  local_488 = pp_Var4;
  local_538 = pp_Var4;
  if (pp_Var4 != (_func_int **)0x0) {
    (**(code **)(*pp_Var4 + 0x10))();
  }
  local_4d8 = &local_540;
  if (local_540 != (long *)0x0) {
    (**(code **)(*local_540 + 0x18))();
  }
  local_450 = &local_538;
  std::
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ::resize((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
           in_stack_fffffffffffff8b8);
  for (local_568 = 0; local_568 < local_518; local_568 = local_568 + 1) {
    local_3c0 = local_52c;
    local_1a8 = local_52c[0];
    local_1ac = 0x19660d;
    local_1b0 = 0x3c6ef35f;
    uVar3 = local_52c[0] * 0x19660d + 0x3c6ef35f;
    if ((local_52c[0] >> 1) % 0x20 == 0) {
      local_360 = local_52c;
      local_23c = 0x19660d;
      local_240 = 0x3c6ef35f;
      local_654 = local_52c[0];
      local_238 = uVar3;
      local_52c[0] = uVar3 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_654 = (uint)(local_568 << 2);
      local_52c[0] = uVar3;
    }
    local_56c = local_654;
    local_3c8 = local_52c;
    local_19c = local_52c[0];
    local_1a0 = 0x19660d;
    local_1a4 = 0x3c6ef35f;
    uVar3 = local_52c[0] * 0x19660d + 0x3c6ef35f;
    if ((local_52c[0] >> 1) % 0x20 == 0) {
      local_368 = local_52c;
      local_230 = 0x19660d;
      local_234 = 0x3c6ef35f;
      local_660 = local_52c[0];
      local_22c = uVar3;
      local_52c[0] = uVar3 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_660 = (int)(local_568 << 2) + 1;
      local_52c[0] = uVar3;
    }
    local_570 = local_660;
    local_3d0 = local_52c;
    local_190 = local_52c[0];
    local_194 = 0x19660d;
    local_198 = 0x3c6ef35f;
    uVar3 = local_52c[0] * 0x19660d + 0x3c6ef35f;
    if ((local_52c[0] >> 1) % 0x20 == 0) {
      local_370 = local_52c;
      local_224 = 0x19660d;
      local_228 = 0x3c6ef35f;
      local_66c = local_52c[0];
      local_220 = uVar3;
      local_52c[0] = uVar3 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_66c = (int)(local_568 << 2) + 2;
      local_52c[0] = uVar3;
    }
    local_574 = local_66c;
    local_3d8 = local_52c;
    local_184 = local_52c[0];
    local_188 = 0x19660d;
    local_18c = 0x3c6ef35f;
    uVar3 = local_52c[0] * 0x19660d + 0x3c6ef35f;
    if ((local_52c[0] >> 1) % 0x20 == 0) {
      local_378 = local_52c;
      local_218 = 0x19660d;
      local_21c = 0x3c6ef35f;
      local_678 = local_52c[0];
      local_214 = uVar3;
      local_52c[0] = uVar3 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_678 = (int)(local_568 << 2) + 3;
      local_52c[0] = uVar3;
    }
    local_578 = local_678;
    QuadMeshNode::Quad::Quad(&local_588,local_654,local_660,local_66c,local_678);
    local_458 = &local_538;
    pvVar5 = std::
             vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
             ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           *)(local_538 + 0x17),local_568);
    pvVar5->v0 = local_588.v0;
    pvVar5->v1 = local_588.v1;
    pvVar5->v2 = local_588.v2;
    pvVar5->v3 = local_588.v3;
  }
  local_460 = &local_538;
  pvVar6 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_538 + 0xe),0);
  local_150 = local_518 << 2;
  local_4b8 = local_150;
  local_4b0 = pvVar6;
  local_58 = local_150;
  local_50 = pvVar6;
  if (pvVar6->size_alloced < local_150) {
    local_48 = local_150;
    if (pvVar6->size_alloced != 0) {
      local_60 = pvVar6->size_alloced;
      while (local_60 < local_58) {
        local_70[1] = 1;
        local_70[0] = local_60 << 1;
        puVar7 = std::max<unsigned_long>(local_70 + 1,local_70);
        local_60 = *puVar7;
      }
      local_48 = local_60;
    }
  }
  else {
    local_48 = pvVar6->size_alloced;
  }
  local_158 = local_48;
  uVar2 = local_150;
  if (local_150 < pvVar6->size_active) {
    while (local_160 = uVar2, local_160 < pvVar6->size_active) {
      uVar2 = local_160 + 1;
    }
    pvVar6->size_active = local_150;
  }
  local_148 = pvVar6;
  if (local_48 == pvVar6->size_alloced) {
    for (local_168 = pvVar6->size_active; local_168 < local_150; local_168 = local_168 + 1) {
      local_140 = pvVar6->items + local_168;
    }
    pvVar6->size_active = local_150;
  }
  else {
    local_170 = pvVar6->items;
    local_108 = local_48;
    local_100 = pvVar6;
    pVVar8 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    pvVar6->items = pVVar8;
    for (local_178 = 0; local_178 < pvVar6->size_active; local_178 = local_178 + 1) {
      local_128 = pvVar6->items + local_178;
      local_130 = local_170 + local_178;
      uVar1 = *(undefined8 *)((long)&local_130->field_0 + 8);
      *(undefined8 *)&local_128->field_0 = *(undefined8 *)&local_130->field_0;
      *(undefined8 *)((long)&local_128->field_0 + 8) = uVar1;
    }
    for (local_180 = pvVar6->size_active; local_180 < local_150; local_180 = local_180 + 1) {
      local_138 = pvVar6->items + local_180;
    }
    local_120 = pvVar6->size_alloced;
    local_118 = local_170;
    local_110 = pvVar6;
    alignedFree(in_stack_fffffffffffff898);
    pvVar6->size_active = local_150;
    pvVar6->size_alloced = local_158;
  }
  for (local_590 = 0; local_590 < local_518 << 2; local_590 = local_590 + 1) {
    local_380 = local_52c;
    local_208 = local_52c[0];
    local_20c = 0x19660d;
    local_210 = 0x3c6ef35f;
    local_1fc = local_52c[0] * 0x19660d + 0x3c6ef35f;
    local_594 = local_52c[0];
    local_388 = local_52c;
    local_200 = 0x19660d;
    local_204 = 0x3c6ef35f;
    local_1f0 = local_1fc * 0x19660d + 0x3c6ef35f;
    local_598 = local_52c[0];
    local_390 = local_52c;
    local_1f4 = 0x19660d;
    local_1f8 = 0x3c6ef35f;
    local_1e4 = local_1f0 * 0x19660d + 0x3c6ef35f;
    local_59c = local_52c[0];
    local_398 = local_52c;
    local_1e8 = 0x19660d;
    local_1ec = 0x3c6ef35f;
    local_5a0 = local_52c[0];
    local_308 = &local_5c8;
    local_2e8 = CONCAT44(local_52c[0],local_52c[0]);
    uStack_2e0 = CONCAT44(local_52c[0],local_52c[0]);
    local_3f0 = &local_5b8;
    local_3f8 = &local_5c8;
    local_2d0 = &local_5b8;
    local_468 = &local_538;
    local_338 = local_5a0;
    local_334 = local_5a0;
    local_330 = local_59c;
    local_32c = local_59c;
    local_328 = local_598;
    local_324 = local_598;
    local_320 = local_594;
    local_31c = local_594;
    local_318 = local_5a0;
    local_314 = local_59c;
    local_310 = local_598;
    local_30c = local_594;
    local_288 = local_2e8;
    uStack_280 = uStack_2e0;
    local_274 = local_594;
    local_270 = local_598;
    local_26c = local_59c;
    local_268 = local_5a0;
    local_5c8 = local_2e8;
    uStack_5c0 = uStack_2e0;
    local_5b8 = local_2e8;
    uStack_5b0 = uStack_2e0;
    local_52c[0] = local_1e4 * 0x19660d + 0x3c6ef35f;
    local_490 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(local_538 + 0xe),0);
    local_498 = local_590;
    local_410 = local_490->items + local_590;
    local_418 = &local_5b8;
    *(undefined8 *)&local_410->field_0 = local_5b8;
    *(undefined8 *)((long)&local_410->field_0 + 8) = uStack_5b0;
  }
  if ((local_519 & 1) != 0) {
    local_470 = &local_538;
    pvVar6 = std::
             vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)(local_538 + 0xe),1);
    local_c8 = local_518 << 2;
    local_4c8 = local_c8;
    local_4c0 = pvVar6;
    local_28 = local_c8;
    local_20 = pvVar6;
    if (pvVar6->size_alloced < local_c8) {
      local_18 = local_c8;
      if (pvVar6->size_alloced != 0) {
        local_30 = pvVar6->size_alloced;
        while (local_30 < local_28) {
          local_40[1] = 1;
          local_40[0] = local_30 << 1;
          puVar7 = std::max<unsigned_long>(local_40 + 1,local_40);
          local_30 = *puVar7;
        }
        local_18 = local_30;
      }
    }
    else {
      local_18 = pvVar6->size_alloced;
    }
    local_d0 = local_18;
    uVar2 = local_c8;
    if (local_c8 < pvVar6->size_active) {
      while (local_d8 = uVar2, local_d8 < pvVar6->size_active) {
        uVar2 = local_d8 + 1;
      }
      pvVar6->size_active = local_c8;
    }
    local_c0 = pvVar6;
    if (local_18 == pvVar6->size_alloced) {
      for (local_e0 = pvVar6->size_active; local_e0 < local_c8; local_e0 = local_e0 + 1) {
        local_b8 = pvVar6->items + local_e0;
      }
      pvVar6->size_active = local_c8;
    }
    else {
      local_e8 = pvVar6->items;
      local_80 = local_18;
      local_78 = pvVar6;
      pVVar8 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
      pvVar6->items = pVVar8;
      for (local_f0 = 0; local_f0 < pvVar6->size_active; local_f0 = local_f0 + 1) {
        local_a0 = pvVar6->items + local_f0;
        local_a8 = local_e8 + local_f0;
        uVar1 = *(undefined8 *)((long)&local_a8->field_0 + 8);
        *(undefined8 *)&local_a0->field_0 = *(undefined8 *)&local_a8->field_0;
        *(undefined8 *)((long)&local_a0->field_0 + 8) = uVar1;
      }
      for (local_f8 = pvVar6->size_active; local_f8 < local_c8; local_f8 = local_f8 + 1) {
        local_b0 = pvVar6->items + local_f8;
      }
      local_98 = pvVar6->size_alloced;
      local_90 = local_e8;
      local_88 = pvVar6;
      alignedFree(in_stack_fffffffffffff898);
      pvVar6->size_active = local_c8;
      pvVar6->size_alloced = local_d0;
    }
    for (local_5d0 = 0; local_5d0 < local_518 << 2; local_5d0 = local_5d0 + 1) {
      local_3a0 = local_52c;
      local_1d8 = local_52c[0];
      local_1dc = 0x19660d;
      local_1e0 = 0x3c6ef35f;
      local_1cc = local_52c[0] * 0x19660d + 0x3c6ef35f;
      local_5d4 = local_52c[0];
      local_3a8 = local_52c;
      local_1d0 = 0x19660d;
      local_1d4 = 0x3c6ef35f;
      local_1c0 = local_1cc * 0x19660d + 0x3c6ef35f;
      local_5d8 = local_52c[0];
      local_3b0 = local_52c;
      local_1c4 = 0x19660d;
      local_1c8 = 0x3c6ef35f;
      local_1b4 = local_1c0 * 0x19660d + 0x3c6ef35f;
      local_5dc = local_52c[0];
      local_3b8 = local_52c;
      local_1b8 = 0x19660d;
      local_1bc = 0x3c6ef35f;
      local_5e0 = local_52c[0];
      local_2f0 = &local_608;
      local_2c8 = CONCAT44(local_52c[0],local_52c[0]);
      uStack_2c0 = CONCAT44(local_52c[0],local_52c[0]);
      local_400 = &local_5f8;
      local_408 = &local_608;
      local_2b0 = &local_5f8;
      local_478 = &local_538;
      local_358 = local_5e0;
      local_354 = local_5e0;
      local_350 = local_5dc;
      local_34c = local_5dc;
      local_348 = local_5d8;
      local_344 = local_5d8;
      local_340 = local_5d4;
      local_33c = local_5d4;
      local_300 = local_5e0;
      local_2fc = local_5dc;
      local_2f8 = local_5d8;
      local_2f4 = local_5d4;
      local_2a8 = local_2c8;
      uStack_2a0 = uStack_2c0;
      local_298 = local_5d4;
      local_294 = local_5d8;
      local_290 = local_5dc;
      local_28c = local_5e0;
      local_608 = local_2c8;
      uStack_600 = uStack_2c0;
      local_5f8 = local_2c8;
      uStack_5f0 = uStack_2c0;
      local_52c[0] = local_1b4 * 0x19660d + 0x3c6ef35f;
      local_4a0 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_538 + 0xe),1);
      local_4a8 = local_5d0;
      local_420 = local_4a0->items + local_5d0;
      local_428 = &local_5f8;
      *(undefined8 *)&local_420->field_0 = local_5f8;
      *(undefined8 *)((long)&local_420->field_0 + 8) = uStack_5f0;
    }
  }
  local_448 = &local_538;
  local_10 = local_538;
  (in_RDI->super_RefCount)._vptr_RefCount = local_538;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_438 = &local_538;
  if (local_538 != (_func_int **)0x0) {
    (**(code **)(*local_538 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageQuadMesh (int hash, size_t numQuads, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),mblur?2:1);

    mesh->quads.resize(numQuads);
    for (size_t i=0; i<numQuads; i++) {
      const unsigned v0 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+0);
      const unsigned v1 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+1);
      const unsigned v2 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+2);
      const unsigned v3 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+3);
      mesh->quads[i] = QuadMeshNode::Quad(v0,v1,v2,v3);
    }

    mesh->positions[0].resize(4*numQuads);
    for (size_t i=0; i<4*numQuads; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float w = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3fa(Vec3ff(x,y,z,w));
    }

    if (mblur) 
    {
      mesh->positions[1].resize(4*numQuads);
      for (size_t i=0; i<4*numQuads; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3fa(Vec3ff(x,y,z,w));
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }